

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_geometric_normal_predictor_base.h
# Opt level: O0

VectorD<long,_3> * __thiscall
draco::
MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::GetPositionForCorner
          (MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,CornerIndex ci)

{
  CornerTable *pCVar1;
  MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  *in_RSI;
  CornerTable *in_RDI;
  value_type data_id;
  uint vert_id;
  CornerTable *corner_table;
  CornerTable *this_00;
  CornerIndex in_stack_ffffffffffffffd0;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_28;
  uint local_24;
  int data_id_00;
  MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  *this_01;
  
  this_00 = in_RDI;
  this_01 = in_RSI;
  pCVar1 = MeshPredictionSchemeData<draco::CornerTable>::corner_table(&in_RSI->mesh_data_);
  data_id_00 = (int)((ulong)pCVar1 >> 0x20);
  local_28.value_ = (uint)CornerTable::Vertex(this_00,in_stack_ffffffffffffffd0);
  local_24 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_28);
  MeshPredictionSchemeData<draco::CornerTable>::vertex_to_data_map(&in_RSI->mesh_data_);
  std::vector<int,_std::allocator<int>_>::at
            ((vector<int,_std::allocator<int>_> *)in_RSI,(size_type)in_RDI);
  GetPositionForDataId(this_01,data_id_00);
  return (VectorD<long,_3> *)this_00;
}

Assistant:

VectorD<int64_t, 3> GetPositionForCorner(CornerIndex ci) const {
    DRACO_DCHECK(this->IsInitialized());
    const auto corner_table = mesh_data_.corner_table();
    const auto vert_id = corner_table->Vertex(ci).value();
    const auto data_id = mesh_data_.vertex_to_data_map()->at(vert_id);
    return GetPositionForDataId(data_id);
  }